

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O0

btVector3 __thiscall btSphereShape::localGetSupportingVertex(btSphereShape *this,btVector3 *vec)

{
  btScalar *in_RSI;
  long *in_RDI;
  btScalar bVar1;
  undefined8 in_XMM1_Qa;
  btVector3 bVar2;
  btVector3 vecnorm;
  btVector3 supVertex;
  btVector3 *in_stack_ffffffffffffff88;
  btVector3 *this_00;
  btVector3 local_5c;
  btScalar local_4c;
  btScalar local_48;
  btScalar local_44;
  btVector3 local_40;
  btScalar local_30 [4];
  btScalar *local_20;
  btVector3 local_10;
  undefined1 auVar3 [12];
  undefined8 uVar4;
  
  local_20 = in_RSI;
  btVector3::btVector3(&local_10);
  local_30._0_8_ = (**(code **)(*in_RDI + 0x88))(in_RDI,local_20);
  local_40.m_floats._0_8_ = *(undefined8 *)local_20;
  local_40.m_floats._8_8_ = *(undefined8 *)(local_20 + 2);
  local_10.m_floats._0_8_ = local_30._0_8_;
  local_10.m_floats._8_8_ = in_XMM1_Qa;
  bVar1 = btVector3::length2((btVector3 *)0x1c4708);
  if (bVar1 < 1.4210855e-14) {
    local_44 = -1.0;
    local_48 = -1.0;
    local_4c = -1.0;
    btVector3::setValue(&local_40,&local_44,&local_48,&local_4c);
  }
  this_00 = &local_40;
  btVector3::normalize(this_00);
  (**(code **)(*in_RDI + 0x60))();
  local_5c = ::operator*(this_00->m_floats,in_stack_ffffffffffffff88);
  btVector3::operator+=(&local_10,&local_5c);
  bVar2.m_floats[0] = local_10.m_floats[0];
  auVar3._4_4_ = local_10.m_floats[1];
  register0x00001240 = local_10.m_floats[2];
  register0x00001244 = local_10.m_floats[3];
  return (btVector3)bVar2.m_floats;
}

Assistant:

btVector3	btSphereShape::localGetSupportingVertex(const btVector3& vec)const
{
	btVector3 supVertex;
	supVertex = localGetSupportingVertexWithoutMargin(vec);

	btVector3 vecnorm = vec;
	if (vecnorm .length2() < (SIMD_EPSILON*SIMD_EPSILON))
	{
		vecnorm.setValue(btScalar(-1.),btScalar(-1.),btScalar(-1.));
	} 
	vecnorm.normalize();
	supVertex+= getMargin() * vecnorm;
	return supVertex;
}